

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
boost::optional_detail::
optional_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::assign(optional_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,optional_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *rhs)

{
  if (this->m_initialized != true) {
    if (rhs->m_initialized != false) {
      (this->m_storage).dummy_ = (rhs->m_storage).dummy_;
      this->m_initialized = true;
    }
    return;
  }
  if (rhs->m_initialized != false) {
    (this->m_storage).dummy_ = (rhs->m_storage).dummy_;
    return;
  }
  this->m_initialized = false;
  return;
}

Assistant:

bool is_initialized() const BOOST_NOEXCEPT { return m_initialized ; }